

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::SchemaElement::write(SchemaElement *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  ssize_t sVar5;
  void *__buf_00;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  undefined4 in_stack_ffffffffffffff38;
  int32_t in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint32_t local_14;
  
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker
            ((TOutputRecursionTracker *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (TProtocol *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_14 = duckdb_apache::thrift::protocol::TProtocol::writeStructBegin
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (((ushort)this->__isset & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),T_STOP,
                       0x6f);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x6fff69);
    local_14 = uVar3 + local_14 + uVar1 + uVar2;
  }
  if (((ushort)this->__isset >> 1 & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),T_STOP,
                       0x6f);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x70004c);
    local_14 = uVar3 + local_14 + uVar1 + uVar2;
  }
  if (((ushort)this->__isset >> 2 & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),T_STOP,
                       0x70);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x7000fc);
    local_14 = uVar3 + local_14 + uVar1 + uVar2;
  }
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),T_STOP,
                     0x70);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeString
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x70018c);
  local_14 = uVar3 + local_14 + uVar1 + uVar2;
  if (((ushort)this->__isset >> 3 & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),T_STOP,
                       0x70);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x70023c);
    local_14 = uVar3 + local_14 + uVar1 + uVar2;
  }
  if (((ushort)this->__isset >> 4 & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),T_STOP,
                       0x70);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x7002ec);
    local_14 = uVar3 + local_14 + uVar1 + uVar2;
  }
  if (((ushort)this->__isset >> 5 & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),T_STOP,
                       0x70);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x70039c);
    local_14 = uVar3 + local_14 + uVar1 + uVar2;
  }
  if (((ushort)this->__isset >> 6 & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),T_STOP,
                       0x70);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x700449);
    local_14 = uVar3 + local_14 + uVar1 + uVar2;
  }
  if (((ushort)this->__isset >> 7 & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),T_STOP,
                       0x70);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x7004f9);
    local_14 = uVar3 + local_14 + uVar1 + uVar2;
  }
  if (((ushort)this->__isset >> 8 & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),T_STOP,
                       0x70);
    sVar5 = LogicalType::write(&this->logicalType,__fd,__buf_00,(ulong)uVar1);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x7005aa);
    local_14 = uVar2 + local_14 + uVar1 + (int)sVar5;
  }
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldStop((TProtocol *)0x7005cf);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeStructEnd((TProtocol *)0x7005f6);
  uVar4 = uVar2 + local_14 + uVar1;
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker
            ((TOutputRecursionTracker *)0x700626);
  return (ulong)uVar4;
}

Assistant:

uint32_t SchemaElement::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("SchemaElement");

  if (this->__isset.type) {
    xfer += oprot->writeFieldBegin("type", ::apache::thrift::protocol::T_I32, 1);
    xfer += oprot->writeI32(static_cast<int32_t>(this->type));
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.type_length) {
    xfer += oprot->writeFieldBegin("type_length", ::apache::thrift::protocol::T_I32, 2);
    xfer += oprot->writeI32(this->type_length);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.repetition_type) {
    xfer += oprot->writeFieldBegin("repetition_type", ::apache::thrift::protocol::T_I32, 3);
    xfer += oprot->writeI32(static_cast<int32_t>(this->repetition_type));
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldBegin("name", ::apache::thrift::protocol::T_STRING, 4);
  xfer += oprot->writeString(this->name);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.num_children) {
    xfer += oprot->writeFieldBegin("num_children", ::apache::thrift::protocol::T_I32, 5);
    xfer += oprot->writeI32(this->num_children);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.converted_type) {
    xfer += oprot->writeFieldBegin("converted_type", ::apache::thrift::protocol::T_I32, 6);
    xfer += oprot->writeI32(static_cast<int32_t>(this->converted_type));
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.scale) {
    xfer += oprot->writeFieldBegin("scale", ::apache::thrift::protocol::T_I32, 7);
    xfer += oprot->writeI32(this->scale);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.precision) {
    xfer += oprot->writeFieldBegin("precision", ::apache::thrift::protocol::T_I32, 8);
    xfer += oprot->writeI32(this->precision);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.field_id) {
    xfer += oprot->writeFieldBegin("field_id", ::apache::thrift::protocol::T_I32, 9);
    xfer += oprot->writeI32(this->field_id);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.logicalType) {
    xfer += oprot->writeFieldBegin("logicalType", ::apache::thrift::protocol::T_STRUCT, 10);
    xfer += this->logicalType.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}